

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O0

ktx_error_code_e
ktxTexture_CreateFromStream
          (ktxStream *pStream,ktxTextureCreateFlags createFlags,ktxTexture **newTex)

{
  ktx_error_code_e kVar1;
  undefined8 *in_RDX;
  undefined4 in_ESI;
  ktxStream *in_RDI;
  ktxStream *unaff_retaddr;
  ktxTexture2 *tex2;
  ktxTexture1 *tex1;
  ktxTexture *tex;
  ktx_error_code_e result;
  ktxFileType_ fileType;
  ktxHeaderUnion_ header;
  void *local_80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  ktxFileType_ *in_stack_ffffffffffffff90;
  ktxStream *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffe8;
  ktxTextureCreateFlags createFlags_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  kVar1 = ktxDetermineFileType_
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     (ktxHeaderUnion_ *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (kVar1 == KTX_SUCCESS) {
    if (in_stack_ffffffffffffff8c == 0) {
      local_80 = malloc(0x90);
      createFlags_00 = (ktxTextureCreateFlags)((ulong)in_RDI >> 0x20);
      if (local_80 == (void *)0x0) {
        return KTX_OUT_OF_MEMORY;
      }
      memset(local_80,0,0x90);
      kVar1 = ktxTexture1_constructFromStreamAndHeader
                        ((ktxTexture1 *)tex2,unaff_retaddr,
                         (KTX_header *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                         ,createFlags_00);
    }
    else {
      local_80 = malloc(0xa8);
      if (local_80 == (void *)0x0) {
        return KTX_OUT_OF_MEMORY;
      }
      memset(local_80,0,0xa8);
      kVar1 = ktxTexture2_constructFromStreamAndHeader
                        ((ktxTexture2 *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                         (KTX_header2 *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                         (ktxTextureCreateFlags)((ulong)in_RDX >> 0x20));
    }
    if (kVar1 == KTX_SUCCESS) {
      *in_RDX = local_80;
    }
    else {
      free(local_80);
      *in_RDX = 0;
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture_CreateFromStream(ktxStream* pStream,
                            ktxTextureCreateFlags createFlags,
                            ktxTexture** newTex)
{
    ktxHeaderUnion_ header;
    ktxFileType_ fileType;
    KTX_error_code result;
    ktxTexture* tex;

    result = ktxDetermineFileType_(pStream, &fileType, &header);
    if (result != KTX_SUCCESS)
        return result;

    if (fileType == KTX1) {
        ktxTexture1* tex1 = (ktxTexture1*)malloc(sizeof(ktxTexture1));
        if (tex1 == NULL)
            return KTX_OUT_OF_MEMORY;
        memset(tex1, 0, sizeof(ktxTexture1));
        result = ktxTexture1_constructFromStreamAndHeader(tex1, pStream,
                                                          &header.ktx,
                                                          createFlags);
        tex = ktxTexture(tex1);
    } else {
        ktxTexture2* tex2 = (ktxTexture2*)malloc(sizeof(ktxTexture2));
        if (tex2 == NULL)
            return KTX_OUT_OF_MEMORY;
        memset(tex2, 0, sizeof(ktxTexture2));
        result = ktxTexture2_constructFromStreamAndHeader(tex2, pStream,
                                                          &header.ktx2,
                                                          createFlags);
        tex = ktxTexture(tex2);
    }

    if (result == KTX_SUCCESS)
        *newTex = (ktxTexture*)tex;
    else {
        free(tex);
        *newTex = NULL;
    }
    return result;
}